

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_gen_impl.h
# Opt level: O2

void secp256k1_ecmult_gen(secp256k1_ecmult_gen_context *ctx,secp256k1_gej *r,secp256k1_scalar *gn)

{
  ulong uVar1;
  secp256k1_ge_storage (*paasVar2) [64] [16];
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  secp256k1_gej *psVar6;
  secp256k1_gej *psVar7;
  secp256k1_scalar local_f0;
  secp256k1_ge add;
  secp256k1_ge_storage adds;
  
  adds.x.n[0] = 0;
  adds.x.n[1] = 0;
  adds.x.n[2] = 0;
  adds.x.n[3] = 0;
  adds.y.n[0] = 0;
  adds.y.n[1] = 0;
  adds.y.n[2] = 0;
  adds.y.n[3] = 0;
  psVar6 = &ctx->initial;
  psVar7 = r;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    (psVar7->x).n[0] = (psVar6->x).n[0];
    psVar6 = (secp256k1_gej *)((psVar6->x).n + 1);
    psVar7 = (secp256k1_gej *)((psVar7->x).n + 1);
  }
  secp256k1_scalar_add(&local_f0,gn,&ctx->blind);
  add.infinity = 0;
  lVar3 = 0;
  for (uVar5 = 0; uVar5 != 0x40; uVar5 = uVar5 + 1) {
    uVar1 = add.x.n[(uVar5 >> 4 & 0xfffffff) - 4];
    paasVar2 = ctx->prec;
    for (uVar4 = 0; uVar4 != 0x400; uVar4 = uVar4 + 0x40) {
      secp256k1_ge_storage_cmov
                (&adds,(secp256k1_ge_storage *)((long)(*paasVar2)[0][0].x.n + uVar4 + lVar3),
                 (uint)(((uint)(uVar1 >> ((char)uVar5 * '\x04' & 0x3fU)) & 0xf) << 6 == uVar4));
    }
    secp256k1_ge_from_storage(&add,&adds);
    secp256k1_gej_add_ge(r,r,&add);
    lVar3 = lVar3 + 0x400;
  }
  secp256k1_ge_clear(&add);
  return;
}

Assistant:

static void secp256k1_ecmult_gen(const secp256k1_ecmult_gen_context *ctx, secp256k1_gej *r, const secp256k1_scalar *gn) {
    secp256k1_ge add;
    secp256k1_ge_storage adds;
    secp256k1_scalar gnb;
    int bits;
    int i, j;
    memset(&adds, 0, sizeof(adds));
    *r = ctx->initial;
    /* Blind scalar/point multiplication by computing (n-b)G + bG instead of nG. */
    secp256k1_scalar_add(&gnb, gn, &ctx->blind);
    add.infinity = 0;
    for (j = 0; j < ECMULT_GEN_PREC_N; j++) {
        bits = secp256k1_scalar_get_bits(&gnb, j * ECMULT_GEN_PREC_B, ECMULT_GEN_PREC_B);
        for (i = 0; i < ECMULT_GEN_PREC_G; i++) {
            /** This uses a conditional move to avoid any secret data in array indexes.
             *   _Any_ use of secret indexes has been demonstrated to result in timing
             *   sidechannels, even when the cache-line access patterns are uniform.
             *  See also:
             *   "A word of warning", CHES 2013 Rump Session, by Daniel J. Bernstein and Peter Schwabe
             *    (https://cryptojedi.org/peter/data/chesrump-20130822.pdf) and
             *   "Cache Attacks and Countermeasures: the Case of AES", RSA 2006,
             *    by Dag Arne Osvik, Adi Shamir, and Eran Tromer
             *    (http://www.tau.ac.il/~tromer/papers/cache.pdf)
             */
            secp256k1_ge_storage_cmov(&adds, &(*ctx->prec)[j][i], i == bits);
        }
        secp256k1_ge_from_storage(&add, &adds);
        secp256k1_gej_add_ge(r, r, &add);
    }
    bits = 0;
    secp256k1_ge_clear(&add);
    secp256k1_scalar_clear(&gnb);
}